

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall CommandDrawString::RealignString(CommandDrawString *this)

{
  int iVar1;
  uint uVar2;
  SBarInfoCoordinate SVar3;
  
  this->x = this->startX;
  if (this->alignment == ALIGN_CENTER) {
    if (((this->super_SBarInfoCommand).script)->spacingCharacter == '\0') {
      iVar1 = FFont::StringWidth(this->font,&this->str);
      uVar2 = *(int *)((this->str).Chars + -0xc) * this->spacing + iVar1 & 0xfffffffe;
      SVar3 = this->x;
      goto LAB_004b6776;
    }
    iVar1 = (*this->font->_vptr_FFont[3])();
    uVar2 = (iVar1 + this->spacing) * *(int *)((this->str).Chars + -0xc) & 0xfffffffe;
    SVar3 = this->x;
  }
  else {
    if (this->alignment != ALIGN_RIGHT) {
      return;
    }
    if (((this->super_SBarInfoCommand).script)->spacingCharacter == '\0') {
      iVar1 = FFont::StringWidth(this->font,&this->str);
      SVar3 = this->x;
      uVar2 = (*(int *)((this->str).Chars + -0xc) * this->spacing + iVar1) * 2;
LAB_004b6776:
      SVar3 = (SBarInfoCoordinate)((int)SVar3 - uVar2);
      goto LAB_004b6778;
    }
    iVar1 = (*this->font->_vptr_FFont[3])();
    SVar3 = this->x;
    uVar2 = (iVar1 + this->spacing) * *(int *)((this->str).Chars + -0xc) * 2;
  }
  SVar3 = (SBarInfoCoordinate)((int)SVar3 - uVar2);
LAB_004b6778:
  this->x = SVar3;
  return;
}

Assistant:

void RealignString()
		{
			x = startX;
			switch (alignment)
			{
			case ALIGN_LEFT:
				break;
			case ALIGN_RIGHT:
				if(script->spacingCharacter == '\0')
					x -= static_cast<int> (font->StringWidth(str)+(spacing * str.Len()));
				else //monospaced, so just multiplay the character size
					x -= static_cast<int> ((font->GetCharWidth((unsigned char) script->spacingCharacter) + spacing) * str.Len());
				break;
			case ALIGN_CENTER:
				if(script->spacingCharacter == '\0')
					x -= static_cast<int> ((font->StringWidth(str)+(spacing * str.Len())) / 2);
				else
					x -= static_cast<int> ((font->GetCharWidth((unsigned char) script->spacingCharacter) + spacing) * str.Len() / 2);
				break;
			}
		}